

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_0::ShaderTextureFunctionCase::ShaderTextureFunctionCase
          (ShaderTextureFunctionCase *this,TestContext *testCtx,string *name,string *desc,
          TextureLookupSpec *lookup,TextureSpec *texture,TexEvalFunc evalFunc,bool isVertexCase)

{
  TexLookupParams *pTVar1;
  bool *pbVar2;
  IVec3 *pIVar3;
  TextureSpec *pTVar4;
  bool bVar5;
  bool bVar6;
  Function FVar7;
  CompareMode CVar8;
  TextureType TVar9;
  TextureType TVar10;
  bool bVar11;
  bool bVar12;
  undefined3 uVar13;
  float fVar14;
  byte bVar15;
  int i;
  DataType DVar16;
  ShaderEvaluator *this_00;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  TextureFormat format;
  char *pcVar20;
  char *pcVar21;
  size_t sVar22;
  size_t sVar23;
  IVec3 *pIVar24;
  int iVar25;
  int iVar26;
  TextureSpec *pTVar27;
  Function FVar28;
  int iVar29;
  ostringstream *this_01;
  uint vecSize;
  size_t sVar30;
  GLSLVersion version;
  ulong uVar31;
  ostream *poVar32;
  bool bVar33;
  char *lodBias;
  char *texCoord;
  ostringstream vert;
  ostringstream frag;
  DataType local_3a8;
  char *local_398;
  char *local_390;
  char *local_388;
  long local_340 [14];
  ios_base local_2d0 [264];
  long *local_1c8 [2];
  long local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  bVar15 = 0;
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_00d2d220;
  this_00 = (ShaderEvaluator *)operator_new(0x20);
  ShaderEvaluator::ShaderEvaluator(this_00);
  pTVar1 = &this->m_lookupParams;
  this_00->_vptr_ShaderEvaluator = (_func_int **)&PTR__ShaderEvaluator_00d2d268;
  this_00[1]._vptr_ShaderEvaluator = (_func_int **)evalFunc;
  this_00[1].m_evalFunc = (ShaderEvalFunc)pTVar1;
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,name,desc,isVertexCase,this_00,
             (UniformSetup *)0x0,(AttributeSetupFunc)0x0);
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_00d2d220;
  FVar7 = lookup->function;
  (this->m_lookupSpec).function = FVar7;
  lVar17 = 0;
  do {
    (this->m_lookupSpec).minCoord.m_data[lVar17] = (lookup->minCoord).m_data[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 4);
  lVar17 = 0;
  do {
    (this->m_lookupSpec).maxCoord.m_data[lVar17] = (lookup->maxCoord).m_data[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 4);
  pbVar2 = &(this->m_lookupSpec).useBias;
  (this->m_lookupSpec).maxLodBias = lookup->maxLodBias;
  uVar13 = *(undefined3 *)&lookup->field_0x25;
  fVar14 = lookup->minLodBias;
  (this->m_lookupSpec).useBias = lookup->useBias;
  *(undefined3 *)&(this->m_lookupSpec).field_0x25 = uVar13;
  (this->m_lookupSpec).minLodBias = fVar14;
  lVar17 = 0;
  do {
    (this->m_lookupSpec).minDX.m_data[lVar17] = (lookup->minDX).m_data[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  lVar17 = 0;
  do {
    (this->m_lookupSpec).maxDX.m_data[lVar17] = (lookup->maxDX).m_data[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  lVar17 = 0;
  do {
    (this->m_lookupSpec).minDY.m_data[lVar17] = (lookup->minDY).m_data[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  lVar17 = 0;
  do {
    (this->m_lookupSpec).maxDY.m_data[lVar17] = (lookup->maxDY).m_data[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  (this->m_lookupSpec).useOffset = lookup->useOffset;
  pIVar3 = &(this->m_lookupSpec).offset;
  lVar17 = 0;
  do {
    (this->m_lookupSpec).offset.m_data[lVar17] = (lookup->offset).m_data[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  pTVar4 = &this->m_textureSpec;
  pTVar27 = pTVar4;
  for (lVar17 = 0x15; lVar17 != 0; lVar17 = lVar17 + -1) {
    pTVar27->type = texture->type;
    texture = (TextureSpec *)((long)texture + (ulong)bVar15 * -8 + 4);
    pTVar27 = (TextureSpec *)((long)pTVar27 + (ulong)bVar15 * -8 + 4);
  }
  pTVar1->lod = 0.0;
  (pTVar1->offset).m_data[0] = 0;
  (this->m_lookupParams).offset.m_data[1] = 0;
  (this->m_lookupParams).offset.m_data[2] = 0;
  (this->m_lookupParams).scale.m_data[0] = 1.0;
  (this->m_lookupParams).scale.m_data[1] = 1.0;
  (this->m_lookupParams).scale.m_data[2] = 1.0;
  (this->m_lookupParams).scale.m_data[3] = 1.0;
  (this->m_lookupParams).bias.m_data[0] = 0.0;
  (this->m_lookupParams).bias.m_data[1] = 0.0;
  (this->m_lookupParams).bias.m_data[2] = 0.0;
  (this->m_lookupParams).bias.m_data[3] = 0.0;
  FVar28 = FVar7 & ~FUNCTION_TEXTURELOD;
  CVar8 = (this->m_textureSpec).sampler.compare;
  TVar9 = (this->m_textureSpec).type;
  if (TVar9 == TEXTURETYPE_2D && CVar8 == COMPAREMODE_NONE) {
    iVar26 = (FVar7 == FUNCTION_TEXTUREPROJGRAD || FVar28 == FUNCTION_TEXTUREPROJ) + 1;
    bVar33 = false;
  }
  else {
    bVar33 = TVar9 == TEXTURETYPE_1D;
    iVar26 = 1;
    if (CVar8 == COMPAREMODE_NONE && TVar9 == TEXTURETYPE_1D) {
      iVar26 = 3;
      bVar33 = true;
      if (FVar28 != FUNCTION_TEXTUREPROJ) {
        iVar26 = (uint)(FVar7 == FUNCTION_TEXTUREPROJGRAD) * 2 + 1;
      }
    }
  }
  if (TVar9 == TEXTURETYPE_1D) {
    iVar25 = 1;
  }
  else if ((TVar9 == TEXTURETYPE_2D) || (TVar9 == TEXTURETYPE_1D_ARRAY)) {
    iVar25 = 2;
  }
  else {
    iVar25 = (TVar9 == TEXTURETYPE_CUBE_ARRAY) + 3;
  }
  bVar5 = *pbVar2;
  iVar29 = 0;
  if (FVar7 - FUNCTION_TEXTUREPROJGRAD < 3 || FVar28 - FUNCTION_TEXTUREPROJ < 3) {
    iVar29 = iVar26;
  }
  bVar6 = (this->super_ShaderRenderCase).m_isVertexCase;
  iVar26 = bVar33 + 1;
  bVar33 = CVar8 != COMPAREMODE_NONE;
  if (!bVar33) {
    iVar26 = 0;
  }
  iVar26 = iVar29 + iVar25 + iVar26;
  iVar25 = 4;
  if (TVar9 != TEXTURETYPE_CUBE_ARRAY || !bVar33) {
    iVar25 = iVar26;
  }
  DVar16 = glu::getDataTypeFloatVec(iVar25);
  pcVar18 = glu::getDataTypeName(DVar16);
  pcVar19 = glu::getPrecisionName(PRECISION_HIGHP);
  format = glu::mapGLInternalFormat((this->m_textureSpec).format);
  TVar10 = pTVar4->type;
  if (((ulong)TVar10 < 5) && ((0x1dU >> (TVar10 & 0x1f) & 1) != 0)) {
    DVar16 = *(DataType *)(&DAT_00b26aa8 + (ulong)TVar10 * 4);
  }
  else {
    DVar16 = TVar10 == TEXTURETYPE_CUBE_ARRAY | TYPE_FLOAT_VEC2;
  }
  pcVar20 = glu::getDataTypeName(DVar16);
  switch(pTVar4->type) {
  case TEXTURETYPE_1D:
    local_3a8 = TYPE_SAMPLER_1D_SHADOW;
    if (CVar8 == COMPAREMODE_NONE) {
      local_3a8 = glu::getSampler1DType(format);
    }
    break;
  case TEXTURETYPE_2D:
    local_3a8 = TYPE_SAMPLER_2D_SHADOW;
    if (CVar8 == COMPAREMODE_NONE) {
      local_3a8 = glu::getSampler2DType(format);
    }
    break;
  case TEXTURETYPE_3D:
    local_3a8 = glu::getSampler3DType(format);
    break;
  case TEXTURETYPE_CUBE_MAP:
    local_3a8 = TYPE_SAMPLER_CUBE_SHADOW;
    if (CVar8 == COMPAREMODE_NONE) {
      local_3a8 = glu::getSamplerCubeType(format);
    }
    break;
  case TEXTURETYPE_1D_ARRAY:
    local_3a8 = TYPE_SAMPLER_1D_ARRAY_SHADOW;
    if (CVar8 == COMPAREMODE_NONE) {
      local_3a8 = glu::getSampler1DArrayType(format);
    }
    break;
  case TEXTURETYPE_2D_ARRAY:
    local_3a8 = TYPE_SAMPLER_2D_ARRAY_SHADOW;
    if (CVar8 == COMPAREMODE_NONE) {
      local_3a8 = glu::getSampler2DArrayType(format);
    }
    break;
  case TEXTURETYPE_CUBE_ARRAY:
    local_3a8 = TYPE_SAMPLER_CUBE_ARRAY_SHADOW;
    if (CVar8 == COMPAREMODE_NONE) {
      local_3a8 = glu::getSamplerCubeArrayType(format);
    }
    break;
  default:
    local_3a8 = TYPE_LAST;
  }
  switch((this->m_lookupSpec).function) {
  case FUNCTION_TEXTURE:
    local_398 = "texture";
    break;
  case FUNCTION_TEXTUREPROJ:
  case FUNCTION_TEXTUREPROJ2:
  case FUNCTION_TEXTUREPROJ3:
    local_398 = "textureProj";
    break;
  case FUNCTION_TEXTURELOD:
    local_398 = "textureLod";
    break;
  case FUNCTION_TEXTUREPROJLOD:
  case FUNCTION_TEXTUREPROJLOD2:
  case FUNCTION_TEXTUREPROJLOD3:
    local_398 = "textureProjLod";
    break;
  case FUNCTION_TEXTUREGRAD:
    local_398 = "textureGrad";
    break;
  case FUNCTION_TEXTUREPROJGRAD:
  case FUNCTION_TEXTUREPROJGRAD2:
  case FUNCTION_TEXTUREPROJGRAD3:
    local_398 = "textureProjGrad";
    break;
  case FUNCTION_TEXELFETCH:
    local_398 = "texelFetch";
    break;
  default:
    bVar12 = true;
    local_398 = (char *)0x0;
    goto LAB_00634381;
  }
  bVar12 = false;
LAB_00634381:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  this_01 = (ostringstream *)local_1a8;
  if (bVar6 != false) {
    this_01 = (ostringstream *)local_340;
  }
  if (pTVar4->type < TEXTURETYPE_LAST) {
    if ((0x2eU >> (pTVar4->type & 0x1f) & 1) == 0) {
      version = GLSL_VERSION_420;
      goto LAB_006343dc;
    }
    version = GLSL_VERSION_310_ES;
    bVar11 = true;
  }
  else {
    version = GLSL_VERSION_LAST;
LAB_006343dc:
    bVar11 = false;
  }
  pcVar21 = glu::getGLSLVersionDeclaration(version);
  if (pcVar21 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                    0x88);
  }
  else {
    sVar22 = strlen(pcVar21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar21,sVar22);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"layout(location = 4) in ",0x18);
  if (pcVar19 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                    0x88);
  }
  else {
    sVar22 = strlen(pcVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar19,sVar22);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," ",1);
  if (pcVar18 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                    0x88);
  }
  else {
    sVar22 = strlen(pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar18,sVar22);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," a_in0;\n",8);
  bVar15 = FVar7 < FUNCTION_LAST & (byte)(0x10f0 >> ((byte)FVar7 & 0x1f));
  FVar28 = FVar7 & ~FUNCTION_TEXTUREPROJ3;
  if (FVar28 == FUNCTION_TEXTUREGRAD) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(location = 5) in ",0x18);
    if (pcVar19 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x88);
    }
    else {
      sVar22 = strlen(pcVar19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar19,sVar22);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," ",1);
    if (pcVar20 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x88);
    }
    else {
      sVar22 = strlen(pcVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar20,sVar22);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," a_in1;\n",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(location = 6) in ",0x18);
    if (pcVar19 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x88);
    }
    else {
      sVar22 = strlen(pcVar19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar19,sVar22);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," ",1);
    if (pcVar20 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x88);
    }
    else {
      sVar22 = strlen(pcVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar20,sVar22);
    }
    lVar17 = 8;
    pcVar21 = " a_in2;\n";
LAB_00634778:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar21,lVar17);
  }
  else if (bVar15 != 0 || (bVar5 & 1U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(location = 5) in ",0x18);
    if (pcVar19 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x88);
    }
    else {
      sVar22 = strlen(pcVar19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar19,sVar22);
    }
    lVar17 = 0xe;
    pcVar21 = " float a_in1;\n";
    goto LAB_00634778;
  }
  pcVar21 = glu::getGLSLVersionDeclaration(version);
  if (pcVar21 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                    0x220);
  }
  else {
    sVar22 = strlen(pcVar21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar21,sVar22);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  if (bVar6 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(location = 0) out ",0x19);
    if (pcVar19 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x88);
    }
    else {
      sVar22 = strlen(pcVar19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar19,sVar22);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," ",1);
    if (pcVar18 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x88);
    }
    else {
      sVar22 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar18,sVar22);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," v_texCoord;\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in ",0x18);
    if (pcVar19 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                      0x220);
    }
    else {
      sVar22 = strlen(pcVar19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,sVar22);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    if (pcVar18 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                      0x220);
    }
    else {
      sVar22 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar22);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," v_texCoord;\n",0xd);
    if (FVar28 == FUNCTION_TEXTUREGRAD) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"layout(location = 1) out ",0x19);
      if (pcVar19 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                        0x88);
      }
      else {
        sVar22 = strlen(pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar19,sVar22);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," ",1);
      if (pcVar20 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                        0x88);
      }
      else {
        sVar22 = strlen(pcVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar20,sVar22);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," v_gradX;\n",10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"layout(location = 2) out ",0x19);
      if (pcVar19 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                        0x88);
      }
      else {
        sVar22 = strlen(pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar19,sVar22);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," ",1);
      if (pcVar20 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                        0x88);
      }
      else {
        sVar22 = strlen(pcVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar20,sVar22);
      }
      pcVar18 = " v_gradY;\n";
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," v_gradY;\n",10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = 1) in ",0x18);
      if (pcVar19 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                        0x220);
      }
      else {
        sVar22 = strlen(pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,sVar22);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      if (pcVar20 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                        0x220);
      }
      else {
        sVar22 = strlen(pcVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,sVar22);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," v_gradX;\n",10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = 2) in ",0x18);
      if (pcVar19 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                        0x220);
      }
      else {
        sVar22 = strlen(pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,sVar22);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      if (pcVar20 == (char *)0x0) {
        lVar17 = 10;
        std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                        0x220);
      }
      else {
        sVar22 = strlen(pcVar20);
        lVar17 = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,sVar22);
      }
      goto LAB_00634e3f;
    }
    if (bVar15 != 0 || (bVar5 & 1U) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"layout(location = 1) out ",0x19);
      if (pcVar19 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                        0x88);
      }
      else {
        sVar22 = strlen(pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar19,sVar22);
      }
      pcVar18 = " float v_lodBias;\n";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340," float v_lodBias;\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = 1) in ",0x18);
      if (pcVar19 == (char *)0x0) {
        lVar17 = 0x12;
        std::ios::clear((int)&stack0xfffffffffffffc38 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                        0x220);
      }
      else {
        sVar22 = strlen(pcVar19);
        lVar17 = 0x12;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,sVar22);
      }
      goto LAB_00634e3f;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(location = 0) out mediump vec4 v_color;\n",0x2f);
    lVar17 = 0x2e;
    pcVar18 = "layout(location = 0) in mediump vec4 v_color;\n";
LAB_00634e3f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,lVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,"layout(set = 0, binding = 0) uniform highp ",0x2b);
  pcVar18 = glu::getDataTypeName(local_3a8);
  iVar25 = (int)this_01;
  if (pcVar18 == (char *)0x0) {
    std::ios::clear(iVar25 + (int)*(undefined8 *)(*(long *)this_01 + -0x18));
  }
  else {
    sVar22 = strlen(pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar18,sVar22);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," u_sampler;\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,
             "layout(set = 0, binding = 1) uniform buf0 { highp vec4 u_scale; };\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,
             "layout(set = 0, binding = 2) uniform buf1 { highp vec4 u_bias; };\n",0x42);
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"out gl_PerVertex {\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\tvec4 gl_Position;\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"};\n",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\nvoid main()\n{\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"\tgl_Position = a_position;\n",0x1b);
  poVar32 = (ostream *)local_1a8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar32,"\nvoid main()\n{\n",0xf);
  if (bVar6 == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\to_color = ",0xb);
    local_388 = "v_texCoord";
    pcVar19 = "v_gradX";
    pcVar18 = "v_gradY";
    local_390 = "v_lodBias";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\tv_color = ",0xb);
    local_388 = "a_in0";
    pcVar18 = "a_in2";
    pcVar19 = "a_in1";
    local_390 = "a_in1";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"vec4(",5);
  if (bVar12) {
    std::ios::clear(iVar25 + (int)*(undefined8 *)(*(long *)this_01 + -0x18));
  }
  else {
    sVar22 = strlen(local_398);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,local_398,sVar22);
  }
  if ((this->m_lookupSpec).useOffset == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Offset",6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"(u_sampler, ",0xc);
  if (FVar7 == FUNCTION_TEXELFETCH) {
    DVar16 = glu::getDataTypeIntVec(iVar26);
    pcVar20 = glu::getDataTypeName(DVar16);
    if (pcVar20 == (char *)0x0) {
      std::ios::clear(iVar25 + (int)*(undefined8 *)(*(long *)this_01 + -0x18));
    }
    else {
      sVar22 = strlen(pcVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar20,sVar22);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"(",1);
  }
  sVar22 = strlen(local_388);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,local_388,sVar22);
  if (FVar7 == FUNCTION_TEXELFETCH) {
    pcVar18 = ")";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", int(",6);
    sVar23 = strlen(local_390);
    sVar30 = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,local_390,sVar23);
LAB_006351db:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar18,sVar30);
  }
  else {
    if (FVar28 == FUNCTION_TEXTUREGRAD) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
      sVar30 = strlen(pcVar19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar19,sVar30);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
LAB_006351d0:
      sVar30 = strlen(pcVar18);
      goto LAB_006351db;
    }
    if (FVar28 == FUNCTION_TEXTURELOD) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
      pcVar18 = local_390;
      goto LAB_006351d0;
    }
  }
  if ((this->m_lookupSpec).useOffset == true) {
    vecSize = 1;
    if ((pTVar4->type & ~TEXTURETYPE_1D_ARRAY) != TEXTURETYPE_1D) {
      vecSize = pTVar4->type == TEXTURETYPE_3D | 2;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
    DVar16 = glu::getDataTypeIntVec(vecSize);
    pcVar18 = glu::getDataTypeName(DVar16);
    if (pcVar18 == (char *)0x0) {
      std::ios::clear(iVar25 + (int)*(undefined8 *)(*(long *)this_01 + -0x18));
    }
    else {
      sVar30 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar18,sVar30);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"(",1);
    uVar31 = 0;
    do {
      pIVar24 = pIVar3;
      if (uVar31 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
        pIVar24 = (IVec3 *)((long)pIVar3->m_data + uVar31);
      }
      std::ostream::operator<<(this_01,pIVar24->m_data[0]);
      uVar31 = uVar31 + 4;
    } while (vecSize << 2 != uVar31);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,")",1);
  }
  if ((TVar9 == TEXTURETYPE_CUBE_ARRAY && bVar33) &&
      (this->m_lookupSpec).function == FUNCTION_TEXTURE) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,local_388,sVar22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,".w",2);
  }
  if (*pbVar2 == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
    sVar22 = strlen(local_390);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,local_390,sVar22);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,")",1);
  pcVar18 = ", 0.0, 0.0, 1.0)";
  if (CVar8 == COMPAREMODE_NONE) {
    pcVar18 = ")*u_scale + u_bias";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,pcVar18,(ulong)(CVar8 == COMPAREMODE_NONE) * 2 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,";\n",2);
  lVar17 = 0x14;
  if (bVar6 == false) {
    poVar32 = (ostream *)local_340;
    std::__ostream_insert<char,std::char_traits<char>>(poVar32,"\tv_texCoord = a_in0;\n",0x15);
    if (FVar28 == FUNCTION_TEXTUREGRAD) {
      lVar17 = 0x12;
      poVar32 = (ostream *)local_340;
      std::__ostream_insert<char,std::char_traits<char>>(poVar32,"\tv_gradX = a_in1;\n",0x12);
      pcVar18 = "\tv_gradY = a_in2;\n";
    }
    else {
      if (bVar15 == 0 && (bVar5 & 1U) == 0) goto LAB_00635446;
      pcVar18 = "\tv_lodBias = a_in1;\n";
    }
  }
  else {
    pcVar18 = "\to_color = v_color;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar32,pcVar18,lVar17);
LAB_00635446:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
  std::ios_base::~ios_base(local_2d0);
  return;
}

Assistant:

ShaderTextureFunctionCase::ShaderTextureFunctionCase (tcu::TestContext&				testCtx,
													  const std::string&			name,
													  const std::string&			desc,
													  const TextureLookupSpec&		lookup,
													  const TextureSpec&			texture,
													  TexEvalFunc					evalFunc,
													  bool							isVertexCase)
	: ShaderRenderCase		(testCtx, name, desc, isVertexCase, new TexLookupEvaluator(evalFunc, m_lookupParams), NULL, NULL)
	, m_lookupSpec			(lookup)
	, m_textureSpec			(texture)
{
	initShaderSources();
}